

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::setCursorAbsoluteColumn(PatternModel *this,int absolute)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int track;
  
  lVar3 = 0x10;
  lVar2 = 0;
  track = 3;
  do {
    if (lVar3 == 0) {
LAB_0016422f:
      setCursorTrack(this,track);
      setCursorColumn(this,absolute);
      return;
    }
    iVar1 = (this->mMaxColumns)._M_elems[lVar2];
    if (absolute < iVar1) {
      track = (int)lVar2;
      goto LAB_0016422f;
    }
    lVar3 = lVar3 + -4;
    lVar2 = lVar2 + 1;
    absolute = absolute - iVar1;
  } while( true );
}

Assistant:

void PatternModel::setCursorAbsoluteColumn(int absolute) {
    // find the track
    int track = -1;
    for (auto max : mMaxColumns) {
        ++track;
        if (absolute < max) {
            break;
        }
        absolute -= max;
    }

    setCursorTrack(track);
    setCursorColumn(absolute);
}